

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
boost::exception_detail::
clone_impl<boost::exception_detail::error_info_injector<std::invalid_argument>_>::clone_impl
          (clone_impl<boost::exception_detail::error_info_injector<std::invalid_argument>_> *this,
          error_info_injector<std::invalid_argument> *x)

{
  *(undefined ***)&this->field_0x38 = &PTR___cxa_pure_virtual_00128f38;
  error_info_injector<std::invalid_argument>::error_info_injector
            (&this->super_error_info_injector<std::invalid_argument>,x);
  *(undefined8 *)&this->super_error_info_injector<std::invalid_argument> = 0x129a70;
  (this->super_error_info_injector<std::invalid_argument>).super_exception._vptr_exception =
       (_func_int **)0x129aa8;
  *(undefined8 *)&this->field_0x38 = 0x129ae0;
  copy_boost_exception
            (&(this->super_error_info_injector<std::invalid_argument>).super_exception,
             &x->super_exception);
  return;
}

Assistant:

clone_impl( clone_impl const & x, clone_tag ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }